

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

int ON_Font::CompareFontNameToHyphenWideChar(wchar_t *lhs,wchar_t *rhs)

{
  bool bVar1;
  int iVar2;
  ON_SHA1_Hash local_50;
  ON_SHA1_Hash local_3c;
  
  iVar2 = 0;
  if (lhs != rhs) {
    if (lhs == (wchar_t *)0x0) {
      iVar2 = 1;
    }
    else if (rhs == (wchar_t *)0x0) {
      iVar2 = -1;
    }
    else {
      FontNameHash(&local_3c,lhs,true);
      FontNameHash(&local_50,rhs,true);
      bVar1 = ::operator==(&local_3c,&local_50);
      iVar2 = 0;
      if (!bVar1) {
        iVar2 = ON_wString::CompareOrdinal(lhs,rhs,true);
      }
    }
  }
  return iVar2;
}

Assistant:

int ON_Font::CompareFontNameToHyphenWideChar(const wchar_t* lhs, const wchar_t* rhs)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  if (ON_Font::FontNameHash(lhs, true) == ON_Font::FontNameHash(rhs, true))
    return 0;
  return ON_wString::CompareOrdinal(lhs, rhs, true);
}